

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O2

void __thiscall pg::PPSolver::setDominion(PPSolver *this,int p)

{
  int vertex;
  int *piVar1;
  uint uVar2;
  ostream *poVar3;
  int strategy;
  int *piVar4;
  uint winner;
  
  if ((this->super_Solver).trace != 0) {
    poVar3 = std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;201mdominion \x1b[36m");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,p);
    std::operator<<(poVar3,"\x1b[m");
  }
  winner = p & 1;
  piVar4 = this->regions[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = this->regions[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (piVar4 == piVar1) {
      if ((this->super_Solver).trace != 0) {
        std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
      }
      Solver::flush(&this->super_Solver);
      return;
    }
    vertex = *piVar4;
    if (this->region[vertex] != p) break;
    uVar2 = Solver::owner(&this->super_Solver,vertex);
    if ((uVar2 == winner) &&
       (((long)this->strategy[vertex] == -1 || (this->region[this->strategy[vertex]] != p)))) {
      __assert_fail("owner(i) != pl or (strategy[i] != -1 and region[strategy[i]] == p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/pp.cpp"
                    ,0xdb,"void pg::PPSolver::setDominion(int)");
    }
    if (1 < (this->super_Solver).trace) {
      poVar3 = std::operator<<((this->super_Solver).logger," ");
      std::ostream::operator<<(poVar3,vertex);
    }
    uVar2 = Solver::owner(&this->super_Solver,vertex);
    strategy = -1;
    if (uVar2 == winner) {
      strategy = this->strategy[vertex];
    }
    Solver::solve(&this->super_Solver,vertex,winner,strategy);
    piVar4 = piVar4 + 1;
  }
  __assert_fail("region[i] == p",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/pp.cpp"
                ,0xda,"void pg::PPSolver::setDominion(int)");
}

Assistant:

void
PPSolver::setDominion(int p)
{
    // found a dominion
    const int pl = p&1;
    if (trace) logger << "\033[1;38;5;201mdominion \033[36m" << p << "\033[m";
    for (int i : regions[p]) {
        assert(region[i] == p);
        assert(owner(i) != pl or (strategy[i] != -1 and region[strategy[i]] == p));
#ifndef NDEBUG
        if (trace >= 2) logger << " " << i;
#endif
        Solver::solve(i, pl, owner(i) == pl ? strategy[i] : -1);
    }
    if (trace) logger << std::endl;
    Solver::flush();
}